

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

void __thiscall QPDF::importJSON(QPDF *this,shared_ptr<InputSource> *is,bool must_be_complete)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  runtime_error *this_00;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158 [3];
  runtime_error *e;
  shared_ptr<InputSource> local_c8;
  undefined1 local_b8 [8];
  JSONReactor reactor;
  bool must_be_complete_local;
  shared_ptr<InputSource> *is_local;
  QPDF *this_local;
  
  reactor._151_1_ = must_be_complete;
  std::shared_ptr<InputSource>::shared_ptr(&local_c8,is);
  JSONReactor::JSONReactor((JSONReactor *)local_b8,this,&local_c8,(bool)(reactor._151_1_ & 1));
  std::shared_ptr<InputSource>::~shared_ptr(&local_c8);
  peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     is);
  JSON::parse((JSON *)&e,peVar3,(Reactor *)local_b8);
  JSON::~JSON((JSON *)&e);
  bVar1 = JSONReactor::anyErrors((JSONReactor *)local_b8);
  if (!bVar1) {
    JSONReactor::~JSONReactor((JSONReactor *)local_b8);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  peVar3 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      is);
  iVar2 = (*peVar3->_vptr_InputSource[3])();
  std::operator+(local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar2),": errors found in JSON");
  std::runtime_error::runtime_error(this_00,(string *)local_158);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDF::importJSON(std::shared_ptr<InputSource> is, bool must_be_complete)
{
    JSONReactor reactor(*this, is, must_be_complete);
    try {
        JSON::parse(*is, &reactor);
    } catch (std::runtime_error& e) {
        throw std::runtime_error(is->getName() + ": " + e.what());
    }
    if (reactor.anyErrors()) {
        throw std::runtime_error(is->getName() + ": errors found in JSON");
    }
}